

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O3

bool __thiscall Parser::Load(Parser *this,string *filename,string *err,Lexer *parent)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  Metrics *this_00;
  int iVar3;
  long *plVar4;
  Metric *pMVar5;
  long *plVar6;
  size_type *psVar7;
  undefined1 uVar8;
  string contents;
  string read_err;
  ScopedMetric metrics_h_scoped;
  string local_e0;
  string local_c0;
  long *local_a0;
  long local_98;
  long local_90;
  long lStack_88;
  undefined1 *local_80;
  undefined8 local_78;
  undefined1 local_70;
  undefined7 uStack_6f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  ScopedMetric local_40;
  
  if (Load(std::__cxx11::string_const&,std::__cxx11::string*,Lexer*)::metrics_h_metric == '\0') {
    iVar3 = __cxa_guard_acquire(&Load(std::__cxx11::string_const&,std::__cxx11::string*,Lexer*)::
                                 metrics_h_metric);
    this_00 = g_metrics;
    if (iVar3 != 0) {
      if (g_metrics == (Metrics *)0x0) {
        pMVar5 = (Metric *)0x0;
      }
      else {
        local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,".ninja parse","");
        pMVar5 = Metrics::NewMetric(this_00,&local_e0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
          operator_delete(local_e0._M_dataplus._M_p,
                          CONCAT71(local_e0.field_2._M_allocated_capacity._1_7_,
                                   local_e0.field_2._M_local_buf[0]) + 1);
        }
      }
      Load::metrics_h_metric = pMVar5;
      __cxa_guard_release(&Load(std::__cxx11::string_const&,std::__cxx11::string*,Lexer*)::
                           metrics_h_metric);
    }
  }
  ScopedMetric::ScopedMetric(&local_40,Load::metrics_h_metric);
  local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
  local_e0._M_string_length = 0;
  local_e0.field_2._M_local_buf[0] = '\0';
  local_78 = 0;
  local_70 = 0;
  local_80 = &local_70;
  iVar3 = (*this->file_reader_->_vptr_FileReader[2])
                    (this->file_reader_,filename,&local_e0,&local_80);
  if (iVar3 == 0) {
    std::__cxx11::string::resize((ulong)&local_e0,(char)local_e0._M_string_length + '\x01');
    iVar3 = (**this->_vptr_Parser)(this,filename,&local_e0,err);
    uVar8 = (undefined1)iVar3;
  }
  else {
    std::operator+(&local_60,"loading \'",filename);
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_60);
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_90 = *plVar6;
      lStack_88 = plVar4[3];
      local_a0 = &local_90;
    }
    else {
      local_90 = *plVar6;
      local_a0 = (long *)*plVar4;
    }
    local_98 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::_M_append((char *)&local_a0,(ulong)local_80);
    paVar1 = &local_c0.field_2;
    psVar7 = (size_type *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_c0.field_2._M_allocated_capacity = *psVar7;
      local_c0.field_2._8_8_ = plVar4[3];
      local_c0._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_c0.field_2._M_allocated_capacity = *psVar7;
      local_c0._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_c0._M_string_length = plVar4[1];
    *plVar4 = (long)psVar7;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    std::__cxx11::string::operator=((string *)err,(string *)&local_c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != paVar1) {
      operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
    }
    if (local_a0 != &local_90) {
      operator_delete(local_a0,local_90 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
    if (parent != (Lexer *)0x0) {
      pcVar2 = (err->_M_dataplus)._M_p;
      local_c0._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_c0,pcVar2,pcVar2 + err->_M_string_length);
      Lexer::Error(parent,&local_c0,err);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != paVar1) {
        operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
      }
    }
    uVar8 = 0;
  }
  if (local_80 != &local_70) {
    operator_delete(local_80,CONCAT71(uStack_6f,local_70) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
    operator_delete(local_e0._M_dataplus._M_p,
                    CONCAT71(local_e0.field_2._M_allocated_capacity._1_7_,
                             local_e0.field_2._M_local_buf[0]) + 1);
  }
  ScopedMetric::~ScopedMetric(&local_40);
  return (bool)uVar8;
}

Assistant:

bool Parser::Load(const string& filename, string* err, Lexer* parent) {
  METRIC_RECORD(".ninja parse");
  string contents;
  string read_err;
  if (file_reader_->ReadFile(filename, &contents, &read_err) !=
      FileReader::Okay) {
    *err = "loading '" + filename + "': " + read_err;
    if (parent)
      parent->Error(string(*err), err);
    return false;
  }

  // The lexer needs a nul byte at the end of its input, to know when it's done.
  // It takes a StringPiece, and StringPiece's string constructor uses
  // string::data().  data()'s return value isn't guaranteed to be
  // null-terminated (although in practice - libc++, libstdc++, msvc's stl --
  // it is, and C++11 demands that too), so add an explicit nul byte.
  contents.resize(contents.size() + 1);

  return Parse(filename, contents, err);
}